

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O3

TypedExpectation<unsigned_int_()> * __thiscall
testing::internal::TypedExpectation<unsigned_int_()>::WillRepeatedly
          (TypedExpectation<unsigned_int_()> *this,Action<unsigned_int_()> *action)

{
  Clause CVar1;
  uint uVar2;
  char *pcVar3;
  FailureReporterInterface *pFVar4;
  element_type *local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_40;
  element_type local_38 [2];
  
  CVar1 = (this->super_ExpectationBase).last_clause_;
  local_48 = local_38;
  if (CVar1 == kWillRepeatedly) {
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_48,
               ".WillRepeatedly() cannot appear more than once in an EXPECT_CALL().","");
    uVar2 = (this->super_ExpectationBase).line_;
    pcVar3 = (this->super_ExpectationBase).file_;
    pFVar4 = GetFailureReporter();
    (*pFVar4->_vptr_FailureReporterInterface[2])(pFVar4,0,pcVar3,(ulong)uVar2,&local_48);
  }
  else {
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_48,".WillRepeatedly() cannot appear after .RetiresOnSaturation().",
               "");
    if (5 < (int)CVar1) {
      uVar2 = (this->super_ExpectationBase).line_;
      pcVar3 = (this->super_ExpectationBase).file_;
      pFVar4 = GetFailureReporter();
      (*pFVar4->_vptr_FailureReporterInterface[2])(pFVar4,0,pcVar3,(ulong)uVar2,&local_48);
    }
  }
  if (local_48 != local_38) {
    operator_delete(local_48,(long)local_38[0]._vptr_CardinalityInterface + 1);
  }
  (this->super_ExpectationBase).last_clause_ = kWillRepeatedly;
  (this->super_ExpectationBase).repeated_action_specified_ = true;
  std::function<unsigned_int_()>::operator=(&(this->repeated_action_).fun_,&action->fun_);
  if ((this->super_ExpectationBase).cardinality_specified_ == false) {
    AtLeast((testing *)&local_48,
            (int)((ulong)((long)(this->super_ExpectationBase).untyped_actions_.
                                super__Vector_base<const_void_*,_std::allocator<const_void_*>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                         (long)(this->super_ExpectationBase).untyped_actions_.
                               super__Vector_base<const_void_*,_std::allocator<const_void_*>_>.
                               _M_impl.super__Vector_impl_data._M_start) >> 3));
    (this->super_ExpectationBase).cardinality_.impl_.
    super___shared_ptr<const_testing::CardinalityInterface,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         local_48;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (&(this->super_ExpectationBase).cardinality_.impl_.
                super___shared_ptr<const_testing::CardinalityInterface,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,&local_40);
    if (local_40._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_40._M_pi);
    }
  }
  ExpectationBase::CheckActionCountIfNotDone(&this->super_ExpectationBase);
  return this;
}

Assistant:

TypedExpectation& WillRepeatedly(const Action<F>& action) {
    if (last_clause_ == kWillRepeatedly) {
      ExpectSpecProperty(false,
                         ".WillRepeatedly() cannot appear "
                         "more than once in an EXPECT_CALL().");
    } else {
      ExpectSpecProperty(last_clause_ < kWillRepeatedly,
                         ".WillRepeatedly() cannot appear "
                         "after .RetiresOnSaturation().");
    }
    last_clause_ = kWillRepeatedly;
    repeated_action_specified_ = true;

    repeated_action_ = action;
    if (!cardinality_specified()) {
      set_cardinality(AtLeast(static_cast<int>(untyped_actions_.size())));
    }

    // Now that no more action clauses can be specified, we check
    // whether their count makes sense.
    CheckActionCountIfNotDone();
    return *this;
  }